

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

string * __thiscall
Session::receive(string *__return_storage_ptr__,Session *this,string *message_name,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments)

{
  string *str;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  undefined1 *local_e0;
  size_t local_d8;
  undefined1 local_d0 [16];
  string local_c0;
  StringInstance local_a0;
  
  iVar3 = std::__cxx11::string::compare((char *)message_name);
  if (iVar3 == 0) {
    this->_is_connected = false;
LAB_0014f4b5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::compare((char *)message_name);
  if (iVar3 == 0) {
    str = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
      bVar2 = Grammar::is_string_value(str);
      if (bVar2) {
        StringInstance::StringInstance
                  (&local_a0,
                   (arguments->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        StringInstance::value_abi_cxx11_(&local_c0,&local_a0);
        pcVar1 = (Server::_instance->_password)._M_dataplus._M_p;
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar1,
                   pcVar1 + (Server::_instance->_password)._M_string_length);
        if (local_c0._M_string_length == local_d8) {
          if (local_c0._M_string_length == 0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp(local_c0._M_dataplus._M_p,local_e0,local_c0._M_string_length);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        StringInstance::~StringInstance(&local_a0);
        if (bVar2) {
          this->_is_authenticated = true;
          goto LAB_0014f4b5;
        }
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar5 = "AuthenticationError: wrong password.";
      }
      else {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar5 = "RuntimeError: invalid argument.";
      }
    }
    else {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar5 = "RuntimeError: wrong number of arguments.";
    }
  }
  else {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar5 = "RuntimeError: invalid message.";
  }
  *puVar4 = pcVar5;
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string Session::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "close") {
        _is_connected = false;
        return "null";
    }
    if (message_name == "authenticateWithPassword:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_string_value(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        if (StringInstance(arguments[0]).value() == Server::get_instance()->get_password()) {
            _is_authenticated = true;
            return "null";
        }
        throw EXC_WRONG_PASSWORD;
    }
    throw EXC_INVALID_MESSAGE;
}